

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitem.cpp
# Opt level: O3

void __thiscall
depspawn::internal::Workitem::insert_in_worklist(Workitem *this,AbstractRunner *itask)

{
  __atomic_flag_data_type _Var1;
  Task *task_ptr;
  long lVar2;
  int iVar3;
  Workitem *pWVar4;
  Workitem *pWVar5;
  ulong uVar6;
  _dep *p_Var7;
  long *plVar8;
  ulong uVar9;
  _dep **pp_Var10;
  uint uVar11;
  _dep **pp_Var12;
  long lVar13;
  long *plVar14;
  int iVar15;
  arg_info *paVar16;
  int iVar17;
  arg_info *this_00;
  Workitem *ancestor;
  bool bVar18;
  ulong auStack_60 [2];
  long *local_50;
  ulong local_48;
  Workitem *local_40;
  int local_34;
  
  uVar11 = (uint)this->nargs_;
  lVar2 = -((ulong)(uVar11 + 1) * 8 + 0xf & 0xfffffffffffffff0);
  plVar14 = (long *)((long)auStack_60 + lVar2 + 8);
  plVar8 = plVar14;
  for (paVar16 = this->args; paVar16 != (arg_info *)0x0; paVar16 = paVar16->next) {
    *plVar8 = (long)paVar16;
    plVar8 = plVar8 + 1;
  }
  auStack_60[1] = (ulong)uVar11;
  plVar14[(int)uVar11] = 0;
  this->task = itask;
  ancestor = this->father;
  pWVar5 = (anonymous_namespace)::worklist;
  do {
    this->next = pWVar5;
    LOCK();
    bVar18 = pWVar5 != (anonymous_namespace)::worklist;
    pWVar4 = this;
    if (bVar18) {
      pWVar5 = (anonymous_namespace)::worklist;
      pWVar4 = (anonymous_namespace)::worklist;
    }
    (anonymous_namespace)::worklist = pWVar4;
    UNLOCK();
  } while (bVar18);
  pWVar5 = this->next;
  if (pWVar5 == (Workitem *)0x0) {
    iVar15 = 0;
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    iVar15 = 0;
    local_50 = plVar14;
    do {
      if (pWVar5 != this) {
        if (pWVar5 == ancestor) {
          ancestor = pWVar5->father;
          if (ancestor == (Workitem *)0x0) {
            ancestor = (Workitem *)0x0;
          }
          else {
            *(undefined8 *)((long)auStack_60 + lVar2) = 0x10a686;
            bVar18 = is_contained(this,ancestor);
            plVar14 = local_50;
            if (bVar18) {
              *(byte *)&this->optFlags_ = (byte)this->optFlags_ | 2;
              break;
            }
          }
        }
        else if ((short)pWVar5->status < 4) {
          local_34 = iVar15;
          paVar16 = pWVar5->args;
          if (paVar16 != (arg_info *)0x0) {
            local_48 = uVar6;
            this_00 = (arg_info *)*plVar14;
            uVar6 = local_48;
            if (this_00 != (arg_info *)0x0) {
              local_40 = ancestor;
              iVar15 = 0;
              do {
                if (this_00->rank == '\0') {
                  if (paVar16->wr == true) {
                    uVar6 = paVar16->addr;
                    uVar9 = this_00->addr;
                  }
                  else {
                    uVar6 = paVar16->addr;
                    uVar9 = this_00->addr;
                    if (this_00->wr != true) goto LAB_0010a644;
                  }
                  bVar18 = uVar9 <= (paVar16->size + uVar6) - 1;
                  if (uVar9 < uVar6) {
                    bVar18 = uVar6 <= (this_00->size + uVar9) - 1;
                  }
                  if (!bVar18) goto LAB_0010a644;
LAB_0010a69f:
                  LOCK();
                  (this->ndependencies).super___atomic_base<int>._M_i =
                       (this->ndependencies).super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                  *(undefined8 *)((long)auStack_60 + lVar2) = 0x10a6af;
                  p_Var7 = LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false>::
                           intl_malloc((LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false>
                                        *)_dep::Pool);
                  p_Var7->next = (_dep *)0x0;
                  p_Var7->w = this;
                  do {
                    LOCK();
                    _Var1 = (pWVar5->deps_mutex_).super___atomic_flag_base._M_i;
                    (pWVar5->deps_mutex_).super___atomic_flag_base._M_i = true;
                    UNLOCK();
                  } while (_Var1 != false);
                  pp_Var12 = &pWVar5->lastdep;
                  if (pWVar5->deps == (_dep *)0x0) {
                    pp_Var10 = &pWVar5->deps;
                  }
                  else {
                    pp_Var10 = pp_Var12;
                    pp_Var12 = &(*pp_Var12)->next;
                  }
                  *pp_Var12 = p_Var7;
                  *pp_Var10 = p_Var7;
                  (pWVar5->deps_mutex_).super___atomic_flag_base._M_i = false;
                  plVar14 = local_50;
                  uVar6 = local_48;
                  ancestor = local_40;
                  if (paVar16->wr != true) break;
                  if (this_00->rank == '\0') {
                    if ((paVar16->addr <= this_00->addr) &&
                       (this_00->addr + this_00->size <= paVar16->addr + paVar16->size))
                    goto LAB_0010a72d;
                    break;
                  }
                  *(undefined8 *)((long)auStack_60 + lVar2) = 0x10a708;
                  bVar18 = arg_info::is_contained_array(this_00,paVar16);
                  plVar14 = local_50;
                  uVar6 = local_48;
                  ancestor = local_40;
                  if (!bVar18) break;
LAB_0010a72d:
                  iVar3 = (int)auStack_60[1];
                  iVar17 = (int)local_48;
                  if (iVar15 < iVar3) {
                    lVar13 = (long)iVar15;
                    do {
                      local_50[lVar13] = local_50[lVar13 + 1];
                      lVar13 = lVar13 + 1;
                    } while (iVar3 != lVar13);
                  }
                  auStack_60[1] = (ulong)(iVar3 - 1);
                  plVar14 = local_50;
                  ancestor = local_40;
                  goto LAB_0010a772;
                }
                uVar6 = paVar16->addr;
                uVar9 = this_00->addr;
                if (uVar6 == uVar9) {
                  *(undefined8 *)((long)auStack_60 + lVar2) = 0x10a5e4;
                  bVar18 = arg_info::overlap_array(this_00,paVar16);
                  plVar14 = local_50;
                  if (bVar18) goto LAB_0010a69f;
LAB_0010a650:
                  lVar13 = (long)iVar15;
                  iVar15 = iVar15 + 1;
                  this_00 = (arg_info *)plVar14[lVar13 + 1];
                }
                else {
LAB_0010a644:
                  if (uVar9 <= uVar6) goto LAB_0010a650;
                  paVar16 = paVar16->next;
                }
                uVar6 = local_48;
                ancestor = local_40;
              } while ((paVar16 != (arg_info *)0x0) && (this_00 != (arg_info *)0x0));
            }
          }
          iVar17 = (int)uVar6;
LAB_0010a772:
          uVar6 = (ulong)(iVar17 + (uint)((short)pWVar5->status < 2));
          iVar15 = local_34 + (uint)(pWVar5->status == Ready);
          if (pWVar5->status == Filling) {
            *(byte *)&this->optFlags_ = (byte)this->optFlags_ | 1;
          }
        }
      }
      pWVar5 = pWVar5->next;
    } while (pWVar5 != (Workitem *)0x0);
  }
  if (iVar15 <= FAST_THRESHOLD) {
    bVar18 = false;
    if ((iVar15 <= Nthreads) || (bVar18 = false, (int)uVar6 <= FAST_THRESHOLD)) goto LAB_0010a7cb;
  }
  bVar18 = true;
LAB_0010a7cb:
  if ((this->ndependencies).super___atomic_base<int>._M_i == 0) {
    this->status = Ready;
    task_ptr = this->task;
    *(undefined8 *)((long)auStack_60 + lVar2) = 0x10a7f0;
    TaskPool::enqueue(TP,task_ptr);
  }
  else {
    this->status = Waiting;
  }
  if (bVar18) {
    TaskPool::try_run(TP);
    return;
  }
  return;
}

Assistant:

void Workitem::insert_in_worklist(AbstractRunner* itask)
    { Workitem* p;
      arg_info *arg_p, *arg_w;

      //Save original list of arguments
      int nargs = static_cast<int>(nargs_);
      arg_info* argv[nargs+1];
      arg_w = args;
      for (int i = 0; arg_w != nullptr; i++) {
        argv[i] = arg_w;     //printf("Fill %d %lu\n", i, arg_w->addr);
        arg_w = arg_w->next;
      }
      argv[nargs] = nullptr;
      
      DEPSPAWN_PROFILEDEFINITION(unsigned int profile_workitems_in_list_lcl = 0,
                                              profile_workitems_in_list_active_lcl = 0);
      DEPSPAWN_PROFILEDEFINITION(bool profile_early_termination_lcl = false);
      
      DEPSPAWN_PROFILEACTION(profile_jobs++);
      
#ifdef DEPSPAWN_FAST_START
#ifdef DEPSPAWN_USE_TBB
      AbstractBoxedFunction *stolen_abf = nullptr;
      static constexpr int FAST_ARR_SZ  = 16;
      Workitem* fast_arr[FAST_ARR_SZ];
#else
      bool steal_work = false;
#endif
      int nready = 0, nfillwait = 0;
#endif
      
      task = itask;
      
      Workitem* ancestor = father;

      next = worklist.load(std::memory_order_relaxed);
      while(!worklist.compare_exchange_weak(next, this));

      for(p = next; p != nullptr; p = p->next) {

        DEPSPAWN_PROFILEACTION(profile_workitems_in_list_lcl++);
        
        // sometimes p == this, even if it shouldn't
        if(p == this) { // fprintf(stderr, "myself?\n");
          continue; // FIXIT
        }
        if(p == ancestor) {
          ancestor = p->father;
          /// TODO: is_contained should be adapted to use argv
          if ( (ancestor != nullptr) && is_contained(this, ancestor)) {
            DEPSPAWN_PROFILEACTION(profile_early_termination_lcl = true);
            optFlags_ |= OptFlags::FatherScape;
            break;
          }
        } else {
          const auto tmp_status = p->status;
          if(tmp_status < Status_t::Done) {
            DEPSPAWN_PROFILEACTION(profile_workitems_in_list_active_lcl++);
            int arg_w_i = 0;
            arg_p = p->args; // preexisting workitem
            arg_w = argv[0]; // New workitem
            while(arg_p && arg_w) {

              const bool conflict = arg_w->is_array()
              ? ( (arg_p->addr == arg_w->addr) && arg_w->overlap_array(arg_p) )
              : ( (arg_p->wr || arg_w->wr) && overlaps(arg_p, arg_w) );
              
              if(conflict) { // Found a dependency
                ndependencies++;
                Workitem::_dep* newdep = Workitem::_dep::Pool.malloc();
                newdep->next = nullptr;
                newdep->w = this;
                
                while (p->deps_mutex_.test_and_set(std::memory_order_acquire))  // acquire lock
                  ; // spin
                
                if(!p->deps)
                  p->deps = p->lastdep = newdep;
                else {
                  p->lastdep->next = newdep;
                  p->lastdep = p->lastdep->next;
                }

                //lock.release();
                p->deps_mutex_.clear(std::memory_order_release);               // release lock
                
                DEPSPAWN_DEBUGACTION(
                                     /* You can be linking to Done's that are waiting for you to Fill-in
                                       but NOT for Deallocatable Workitems */
                                     if(p->status == Status_t::Deallocatable) {
                                       printf("%p -> Deallocatable %p (was %d)", this, p, (int)tmp_status);
                                       assert(false);
                                     }
                                     ); // END DEPSPAWN_DEBUGACTION
                if (arg_p->wr &&
                    (arg_w->is_array() ? arg_w->is_contained_array(arg_p) : contains(arg_p, arg_w))) {
                  nargs--;
                  /*
                  if (!nargs) {
                    DEPSPAWN_PROFILEACTION(profile_early_termination_lcl = true); //not true actually...
                    // The optimal thing would be to just make this goto to leave the main loop and insert
                    // the Workitem waiting. But in tests with repeated spawns this leads to very fast insertion
                    // that slows down the performance. Other advantages of continuing down the list:
                    // - More likely DEPSPAWN_FAST_START is triggered and it uses oldest tasks
                    // - optFlags_ is correctly computed
      
                    //goto OUT_MAIN_insert_in_worklist_LOOP;
      
                      argv[0] = nullptr;
                    //break; //There is another break anyway there down
                  } else {
                   */
                    for (int i = arg_w_i; i <= nargs; i++) {
                      argv[i] = argv[i+1];
                    }
                  /*}*/
                }
                break;
              } else {
                if(arg_p->addr < arg_w->addr) {
                  arg_p = arg_p->next;
                } else {
                  arg_w = argv[++arg_w_i];
                }
              }
            }
            
#ifdef DEPSPAWN_FAST_START
            const auto tmp_status = p->status;
            nfillwait += ( tmp_status < Status_t::Ready );
            if ( tmp_status == Status_t::Ready ) {
#ifdef DEPSPAWN_USE_TBB
              fast_arr[nready & (FAST_ARR_SZ - 1)] = p;
#endif
              nready++;
            }
#endif
            if( p->status == Status_t::Filling ) {
              optFlags_ |=  OptFlags::PendingFills;
            }
          }
        }
      }
      
//OUT_MAIN_insert_in_worklist_LOOP:
      
#ifdef DEPSPAWN_FAST_START
      if ((nready > FAST_THRESHOLD) || ((nready > Nthreads) && (nfillwait > FAST_THRESHOLD))) {
        DEPSPAWN_PROFILEACTION(profile_steal_attempts++);
#ifdef DEPSPAWN_USE_TBB
        nready = (nready - 1) & (FAST_ARR_SZ - 1);
        do {
          p = fast_arr[nready--];
          stolen_abf = p->steal();
        } while ( (stolen_abf == nullptr) && (nready >= 0) );
#else
        steal_work = true;
#endif
      }
#endif

      // This is set after stealing work because this way
      // the fast_arr workitems should not have been deallocated
      //status = (!ndependencies) ? Ready : Waiting;
      if (!ndependencies) {
        post();
      } else {
        status = Status_t::Waiting;
      }

#ifdef DEPSPAWN_FAST_START
#ifdef DEPSPAWN_USE_TBB
      if (stolen_abf != nullptr) {
        DEPSPAWN_PROFILEACTION(profile_steals++);
        stolen_abf->run_in_env(false);
        delete stolen_abf;
      }
#else
      if(steal_work && TP->try_run()) {
        DEPSPAWN_PROFILEACTION(profile_steals++);
      }
#endif
#endif
      
      DEPSPAWN_PROFILEACTION(
                             if(profile_early_termination_lcl) {
                               profile_early_terminations++;
                               profile_workitems_in_list_early_termination += profile_workitems_in_list_lcl;
                               profile_workitems_in_list_active_early_termination += profile_workitems_in_list_active_lcl;
                             }
                             profile_workitems_in_list += profile_workitems_in_list_lcl;
                             profile_workitems_in_list_active += profile_workitems_in_list_active_lcl;
                             );
    }